

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage3d_incomplete_framebuffer
               (NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  allocator<char> local_41;
  string local_40;
  GLuint local_1c;
  GLuint local_18;
  GLuint texture [2];
  GLuint fbo;
  NegativeTestContext *ctx_local;
  
  texture[0] = 0x1234;
  unique0x100002b1 = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,&local_1c);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x806f,local_1c)
  ;
  glu::CallLogWrapper::glTexImage3D
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x806f,0,0x1908,4,4,4,0,0x1908,0x1401,
             (void *)0x0);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c1a,local_18)
  ;
  glu::CallLogWrapper::glTexImage3D
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c1a,0,0x1908,4,4,4,0,0x1908,0x1401,
             (void *)0x0);
  glu::CallLogWrapper::glGenFramebuffers(&stack0xfffffffffffffff0->super_CallLogWrapper,1,texture);
  glu::CallLogWrapper::glBindFramebuffer
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8ca8,texture[0]);
  glu::CallLogWrapper::glCheckFramebufferStatus
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8ca8);
  this = stack0xfffffffffffffff0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,&local_41);
  NegativeTestContext::beginSection(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glCopyTexSubImage3D
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x806f,0,0,0,0,0,0,4,4);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x506);
  glu::CallLogWrapper::glCopyTexSubImage3D
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c1a,0,0,0,0,0,0,4,4);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x506);
  NegativeTestContext::endSection(stack0xfffffffffffffff0);
  glu::CallLogWrapper::glBindFramebuffer(&stack0xfffffffffffffff0->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers
            (&stack0xfffffffffffffff0->super_CallLogWrapper,1,texture);
  glu::CallLogWrapper::glDeleteTextures(&stack0xfffffffffffffff0->super_CallLogWrapper,2,&local_1c);
  return;
}

Assistant:

void copytexsubimage3d_incomplete_framebuffer (NegativeTestContext& ctx)
{
	GLuint fbo = 0x1234;
	GLuint texture[2];

	ctx.glGenTextures			(2, texture);
	ctx.glBindTexture			(GL_TEXTURE_3D, texture[0]);
	ctx.glTexImage3D			(GL_TEXTURE_3D, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture			(GL_TEXTURE_2D_ARRAY, texture[1]);
	ctx.glTexImage3D			(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glGenFramebuffers		(1, &fbo);
	ctx.glBindFramebuffer		(GL_READ_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_READ_FRAMEBUFFER);

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glCopyTexSubImage3D(GL_TEXTURE_3D, 0, 0, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.endSection();

	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.glDeleteTextures(2, texture);
}